

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O1

void print_instr(Emulator *e,Instr instr,_Bool print_memory)

{
  InstrFormat IVar1;
  char *__format;
  u16 uVar2;
  int iVar3;
  long lVar4;
  anon_union_4_2_94730066_for_Instr_4 addr;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char *__s;
  anon_union_4_2_94730066_for_Instr_4 aVar9;
  ulong uVar10;
  char *__s_00;
  char buf [100];
  char local_98 [104];
  
  addr = instr.field_4;
  uVar8 = instr._0_8_;
  uVar10 = uVar8 & 0xffffffff;
  IVar1 = s_op_info[uVar10].format;
  __format = s_op_info[uVar10].fmt_str;
  iVar5 = 0;
  __s_00 = local_98;
  iVar3 = snprintf(__s_00,100,"\x1b[32m%s\x1b[37m ",s_op_info[uVar10].op_str);
  iVar6 = 0;
  if (10 < IVar1 - FORMAT_M) goto LAB_0010380a;
  uVar10 = uVar8 >> 0x28;
  lVar4 = (long)iVar3;
  __s = local_98 + lVar4;
  uVar7 = instr._4_4_;
  iVar6 = iVar5;
  switch(IVar1) {
  case FORMAT_M:
    break;
  case FORMAT_N:
    uVar10 = uVar8 >> 0x20;
    break;
  case FORMAT_NM:
    aVar9.d = uVar7 >> 8 & 0xff;
    uVar10 = (ulong)(uVar7 & 0xff);
    goto LAB_001037c4;
  case FORMAT_MD:
    goto LAB_001037be;
  default:
    uVar10 = uVar8 >> 0x20;
LAB_001037be:
    uVar10 = uVar10 & 0xff;
    aVar9.d = addr.d;
LAB_001037c4:
    snprintf(__s,100 - lVar4,__format,(ulong)aVar9.d,uVar10);
    goto LAB_0010380a;
  case FORMAT_NMD:
    snprintf(__s,100 - lVar4,__format,(ulong)(uVar7 >> 8 & 0xff),(ulong)addr.d,(ulong)(uVar7 & 0xff)
            );
    goto LAB_0010380a;
  case FORMAT_D:
  case FORMAT_D12:
  case FORMAT_I:
    uVar10 = (ulong)addr.d;
    goto LAB_001037ea;
  }
  uVar10 = uVar10 & 0xff;
LAB_001037ea:
  snprintf(__s,100 - lVar4,__format,uVar10);
LAB_0010380a:
  do {
    if (*__s_00 == '\x1b') {
      for (; (*__s_00 != '\0' && (*__s_00 != 'm')); __s_00 = __s_00 + 1) {
      }
    }
    else {
      if (*__s_00 == '\0') {
        printf("%s%*s",local_98,(ulong)(0x1e - iVar6),"");
        if (print_memory) {
          if ((IVar1 == FORMAT_ND8) || (instr.op == MOVA_A_D_PC_R0 && IVar1 == FORMAT_D)) {
            if (instr.op == MOVW_A_D_PC_RN) {
              uVar2 = read_u16(e,addr.d);
              uVar7 = (uint)(short)uVar2;
            }
            else {
              uVar7 = read_u32(e,addr.d);
            }
            printf("; 0x%08x",(ulong)uVar7);
          }
        }
        return;
      }
      iVar6 = iVar6 + 1;
    }
    __s_00 = __s_00 + 1;
  } while( true );
}

Assistant:

void print_instr(Emulator* e, Instr instr, bool print_memory) {
  char buf[100];
  char* bufp = buf;

#define SNCAT(...) \
  bufp += snprintf(bufp, sizeof(buf) - (bufp - buf), __VA_ARGS__)

  OpInfo op_info = s_op_info[instr.op];
  SNCAT(GREEN "%s" WHITE " ", op_info.op_str);

  // clang-format off
  switch (op_info.format) {
    case FORMAT_0: break;
    case FORMAT_M: SNCAT(op_info.fmt_str, instr.m); break;
    case FORMAT_N: SNCAT(op_info.fmt_str, instr.n); break;
    case FORMAT_NM: SNCAT(op_info.fmt_str, instr.m, instr.n); break;
    case FORMAT_MD: SNCAT(op_info.fmt_str, instr.d, instr.m); break;
    case FORMAT_NMD: SNCAT(op_info.fmt_str, instr.m, instr.d, instr.n); break;
    case FORMAT_D:
    case FORMAT_D12: SNCAT(op_info.fmt_str, instr.d); break;
    case FORMAT_ND4:
    case FORMAT_ND8: SNCAT(op_info.fmt_str, instr.d, instr.n); break;
    case FORMAT_I: SNCAT(op_info.fmt_str, instr.i); break;
    case FORMAT_NI: SNCAT(op_info.fmt_str, instr.i, instr.n); break;
  }
  // clang-format on

#undef SNCAT

  /* Count the length of the instruction, skipping color escape codes. */
  int count = 0;
  const char* p;
  for (p = buf; *p; ++p) {
    if (*p == '\x1b') {
      while (*p && *p != 'm') p++;
    } else {
      ++count;
    }
  }

  /* Pad out the instruction with spaces, so whatever follows is aligned. */
  printf("%s%*s", buf, INSTR_COLUMNS - count, "");

  if (print_memory) {
    if ((op_info.format == FORMAT_D && instr.op == MOVA_A_D_PC_R0) ||
        (op_info.format == FORMAT_ND8)) {
      /* PC relative memory access */
      u32 val;
      if (instr.op == MOVW_A_D_PC_RN) {
        val = SIGN_EXTEND(read_u16(e, instr.d), 16);
      } else {
        val = read_u32(e, instr.d);
      }
      printf("; 0x%08x", val);
    }
  }
}